

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RollupOutput::PrettyPrint(RollupOutput *this,OutputOptions *options,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RDX;
  OutputOptions *in_RSI;
  RollupRow *in_RDI;
  ostream *in_stack_00000020;
  OutputOptions *in_stack_00000028;
  size_t in_stack_00000030;
  RollupRow *in_stack_00000038;
  RollupOutput *in_stack_00000040;
  bool in_stack_000000c7;
  int64_t in_stack_000000c8;
  uint64_t filtered;
  uint64_t vm_filtered;
  uint64_t file_filtered;
  RollupRow *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range1;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *in_stack_fffffffffffffed8;
  __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  *in_stack_fffffffffffffee0;
  string *psVar3;
  ostream *in_stack_ffffffffffffff00;
  OutputOptions *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  RollupOutput *in_stack_ffffffffffffff20;
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  long local_50;
  long local_48;
  long local_40;
  reference local_38;
  RollupRow *local_30;
  __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_28;
  RollupRow *local_20;
  ostream *local_18;
  OutputOptions *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = anon_unknown_33::ShowFile(in_RSI);
  if (bVar1) {
    std::operator<<(local_18,"    FILE SIZE   ");
  }
  bVar1 = anon_unknown_33::ShowVM(local_10);
  if (bVar1) {
    std::operator<<(local_18,"     VM SIZE    ");
  }
  std::operator<<(local_18,"\n");
  bVar1 = anon_unknown_33::ShowFile(local_10);
  if (bVar1) {
    std::operator<<(local_18," -------------- ");
  }
  bVar1 = anon_unknown_33::ShowVM(local_10);
  if (bVar1) {
    std::operator<<(local_18," -------------- ");
  }
  std::operator<<(local_18,"\n");
  local_20 = in_RDI + 1;
  local_28._M_current =
       (RollupRow *)
       std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                 (in_stack_fffffffffffffed8);
  local_30 = (RollupRow *)
             std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                       (in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffee0,
                            (__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
               ::operator*(&local_28);
    PrettyPrintTree(in_stack_ffffffffffffff20,in_RDI,in_stack_ffffffffffffff10,
                    in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    __gnu_cxx::
    __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
    ::operator++(&local_28);
  }
  PrettyPrintRow(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                 in_stack_00000020);
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  bVar1 = anon_unknown_33::ShowFile(local_10);
  if (bVar1) {
    local_50 = (long)in_RDI->vmpercent + local_50;
  }
  bVar1 = anon_unknown_33::ShowVM(local_10);
  if (bVar1) {
    local_50 = in_RDI->sortkey + local_50;
  }
  if ((local_48 != 0) || (local_40 != 0)) {
    std::operator<<(local_18,"Filtering enabled (source_filter); omitted");
    poVar2 = local_18;
    if ((local_40 == 0) || (local_48 == 0)) {
      if (local_40 == 0) {
        psVar3 = (string *)&stack0xffffffffffffff20;
        (anonymous_namespace)::SiPrint_abi_cxx11_(in_stack_000000c8,in_stack_000000c7);
        std::operator<<(poVar2,psVar3);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      }
      else {
        (anonymous_namespace)::SiPrint_abi_cxx11_(in_stack_000000c8,in_stack_000000c7);
        std::operator<<(poVar2,local_c0);
        std::__cxx11::string::~string(local_c0);
      }
    }
    else {
      poVar2 = std::operator<<(local_18," file =");
      psVar3 = local_70;
      (anonymous_namespace)::SiPrint_abi_cxx11_(in_stack_000000c8,in_stack_000000c7);
      poVar2 = std::operator<<(poVar2,psVar3);
      poVar2 = std::operator<<(poVar2,", vm =");
      (anonymous_namespace)::SiPrint_abi_cxx11_(in_stack_000000c8,in_stack_000000c7);
      std::operator<<(poVar2,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_70);
    }
    std::operator<<(local_18," of entries\n");
  }
  return;
}

Assistant:

void RollupOutput::PrettyPrint(const OutputOptions& options,
                               std::ostream* out) const {
  if (ShowFile(options)) {
    *out << "    FILE SIZE   ";
  }

  if (ShowVM(options)) {
    *out << "     VM SIZE    ";
  }

  *out << "\n";

  if (ShowFile(options)) {
    *out << " -------------- ";
  }

  if (ShowVM(options)) {
    *out << " -------------- ";
  }

  *out << "\n";

  for (const auto& child : toplevel_row_.sorted_children) {
    PrettyPrintTree(child, 0, options, out);
  }

  // The "TOTAL" row comes after all other rows.
  PrettyPrintRow(toplevel_row_, 0, options, out);

  uint64_t file_filtered = 0;
  uint64_t vm_filtered = 0;
  uint64_t filtered = 0;
  if (ShowFile(options)) {
    filtered += toplevel_row_.filtered_size.file;
  }
  if (ShowVM(options)) {
    filtered += toplevel_row_.filtered_size.vm;
  }

  if (vm_filtered == 0 && file_filtered == 0) {
    return;
  }

  *out << "Filtering enabled (source_filter); omitted";

  if (file_filtered > 0 && vm_filtered > 0) {
    *out << " file =" << SiPrint(file_filtered, /*force_sign=*/false)
         << ", vm =" << SiPrint(vm_filtered, /*force_sign=*/false);
  } else if (file_filtered > 0) {
    *out << SiPrint(file_filtered, /*force_sign=*/false);
  } else {
    *out << SiPrint(vm_filtered, /*force_sign=*/false);
  }

  *out << " of entries\n";
}